

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O0

void nhr_request_add_parameter(nhr_request request,char *name,char *value)

{
  _nhr_map_node *p_Var1;
  char *pcVar2;
  size_t local_48;
  size_t local_40;
  _nhr_map_node *last;
  size_t value_len;
  size_t name_len;
  char *value_local;
  char *name_local;
  nhr_request request_local;
  
  if (request != (nhr_request)0x0) {
    if (name == (char *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = strlen(name);
    }
    if (value == (char *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = strlen(value);
    }
    if ((local_40 != 0) && (local_48 != 0)) {
      if (request->method == 0) {
        __assert_fail("request->method",
                      "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_public.c"
                      ,0x97,
                      "void nhr_request_add_parameter(nhr_request, const char *, const char *)");
      }
      if (request->parameters == (_nhr_map_node *)0x0) {
        p_Var1 = nhr_map_create();
        request->parameters = p_Var1;
      }
      p_Var1 = nhr_map_append(request->parameters);
      pcVar2 = nhr_string_copy_len(name,local_40);
      p_Var1->key = pcVar2;
      pcVar2 = nhr_string_copy_len(value,local_48);
      (p_Var1->value).string = pcVar2;
      p_Var1->value_size = local_48;
      p_Var1->value_type = '\x02';
    }
  }
  return;
}

Assistant:

void nhr_request_add_parameter(nhr_request request, const char * name, const char * value) {
	size_t name_len = 0, value_len = 0;
	_nhr_map_node * last = NULL;
	if (!request) {
		return;
	}

	name_len = name ? strlen(name) : 0;
	value_len = value ? strlen(value) : 0;
	if (name_len == 0 || value_len == 0) {
		return;
	}

	assert(request->method); //!!! set method

	if (!request->parameters) {
		request->parameters = nhr_map_create();
	}
	
	last = nhr_map_append(request->parameters);
	last->key = nhr_string_copy_len(name, name_len);
	last->value.string = nhr_string_copy_len(value, value_len);
    last->value_size = value_len;
	last->value_type = NHR_MAP_VALUE_STRING;
}